

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O2

unique_ptr<wasm_functype_t,_std::default_delete<wasm_functype_t>_> __thiscall
wabt::MakeUnique<wasm_functype_t,wabt::interp::FuncType&>(wabt *this,FuncType *args)

{
  wasm_functype_t *this_00;
  FuncType local_60;
  
  this_00 = (wasm_functype_t *)operator_new(0x30);
  interp::FuncType::FuncType(&local_60,args);
  wasm_functype_t::wasm_functype_t(this_00,&local_60);
  *(wasm_functype_t **)this = this_00;
  interp::FuncType::~FuncType(&local_60);
  return (__uniq_ptr_data<wasm_functype_t,_std::default_delete<wasm_functype_t>,_true,_true>)
         (__uniq_ptr_data<wasm_functype_t,_std::default_delete<wasm_functype_t>,_true,_true>)this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}